

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

_Bool arm_el_is_aa64(CPUARMState_conflict *env,int el)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  if (2 < el - 1U) {
    __assert_fail("el >= 1 && el <= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/cpu.h"
                  ,0x7f3,"_Bool arm_el_is_aa64(CPUARMState *, int)");
  }
  uVar1 = env->features;
  uVar3 = (uint)uVar1 & 0x10000000;
  bVar2 = (byte)(uVar3 >> 0x1c);
  if (el != 3) {
    uVar4 = 0;
    if ((uVar1 & 0x200000000) == 0) {
      uVar4 = uVar3 >> 0x1c;
    }
    if ((~uVar1 & 0x210000000) == 0) {
      uVar4 = (uint)(env->cp15).scr_el3 >> 10;
    }
    bVar2 = (byte)uVar4;
    if (((el != 2) && ((uVar1 >> 0x20 & 1) != 0)) &&
       (((uVar1 & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)))) {
      if ((uVar4 & 1) == 0) {
        bVar2 = 0;
      }
      else {
        bVar2 = (byte)((env->cp15).hcr_el2 >> 0x1f);
      }
    }
  }
  return (_Bool)(bVar2 & 1);
}

Assistant:

static inline bool arm_el_is_aa64(CPUARMState *env, int el)
{
    /* This isn't valid for EL0 (if we're in EL0, is_a64() is what you want,
     * and if we're not in EL0 then the state of EL0 isn't well defined.)
     */
    assert(el >= 1 && el <= 3);
    bool aa64 = arm_feature(env, ARM_FEATURE_AARCH64);

    /* The highest exception level is always at the maximum supported
     * register width, and then lower levels have a register width controlled
     * by bits in the SCR or HCR registers.
     */
    if (el == 3) {
        return aa64;
    }

    if (arm_feature(env, ARM_FEATURE_EL3)) {
        aa64 = aa64 && (env->cp15.scr_el3 & SCR_RW);
    }

    if (el == 2) {
        return aa64;
    }

    if (arm_feature(env, ARM_FEATURE_EL2) && !arm_is_secure_below_el3(env)) {
        aa64 = aa64 && (env->cp15.hcr_el2 & HCR_RW);
    }

    return aa64;
}